

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O3

Fl_Type * __thiscall Fl_Decl_Type::make(Fl_Decl_Type *this)

{
  int iVar1;
  Fl_Type *this_00;
  Fl_Type *p;
  
  for (p = Fl_Type::current; p != (Fl_Type *)0x0; p = p->parent) {
    iVar1 = (*p->_vptr_Fl_Type[0x24])(p);
    if (iVar1 != 0) goto LAB_0017a012;
  }
  p = (Fl_Type *)0x0;
LAB_0017a012:
  this_00 = (Fl_Type *)operator_new(0x80);
  this_00->_vptr_Fl_Type = (_func_int **)0x0;
  this_00->name_ = (char *)0x0;
  this_00->label_ = (char *)0x0;
  this_00->callback_ = (char *)0x0;
  this_00->user_data_ = (char *)0x0;
  this_00->user_data_type_ = (char *)0x0;
  this_00->comment_ = (char *)0x0;
  this_00->parent = (Fl_Type *)0x0;
  this_00->new_selected = '\0';
  this_00->selected = '\0';
  this_00->open_ = '\0';
  this_00->visible = '\0';
  this_00->rtti = '\0';
  *(undefined3 *)&this_00->field_0x45 = 0;
  *(undefined8 *)&this_00->level = 0;
  this_00->next = (Fl_Type *)0x0;
  this_00->prev = (Fl_Type *)0x0;
  this_00->factory = (Fl_Type *)0x0;
  this_00->code_position = 0;
  this_00->header_position = 0;
  this_00->code_position_end = 0;
  this_00->header_position_end = 0;
  this_00[1]._vptr_Fl_Type = (_func_int **)0x0;
  Fl_Type::Fl_Type(this_00);
  this_00->_vptr_Fl_Type = (_func_int **)&PTR_setlabel_00270ac0;
  *(undefined2 *)&this_00[1]._vptr_Fl_Type = 0x100;
  Fl_Type::name(this_00,"int x;");
  Fl_Type::add(this_00,p);
  this_00->factory = &this->super_Fl_Type;
  return this_00;
}

Assistant:

Fl_Type *Fl_Decl_Type::make() {
  Fl_Type *p = Fl_Type::current;
  while (p && !p->is_decl_block()) p = p->parent;
  Fl_Decl_Type *o = new Fl_Decl_Type();
  o->public_ = 0;
  o->static_ = 1;
  o->name("int x;");
  o->add(p);
  o->factory = this;
  return o;
}